

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O2

ssize_t sf_parse_params(uint8_t *begin,uint8_t *end)

{
  uint8_t *begin_00;
  ssize_t sVar1;
  uint8_t *puVar2;
  ssize_t sVar3;
  uint8_t *puVar4;
  
  puVar2 = begin;
  while( true ) {
    puVar4 = end;
    if ((puVar2 == end) || (puVar4 = puVar2, *puVar2 != ';')) {
      return (long)puVar4 - (long)begin;
    }
    puVar4 = puVar2 + 1;
    do {
      begin_00 = puVar4;
      if (begin_00 == end) {
        return -1;
      }
      puVar4 = begin_00 + 1;
    } while (*begin_00 == ' ');
    sVar1 = sf_parse_key(begin_00,end);
    if (sVar1 < 0) break;
    puVar2 = puVar4 + sVar1 + -1;
    if ((puVar2 != end) && (begin_00[sVar1] == '=')) {
      if (puVar4 + sVar1 == end) {
        return -1;
      }
      sVar3 = sf_parse_bare_item((nghttp2_sf_value *)0x0,puVar4 + sVar1,end);
      if (sVar3 < 0) {
        return -1;
      }
      puVar2 = puVar4 + sVar3 + sVar1;
    }
  }
  return -1;
}

Assistant:

static ssize_t sf_parse_params(const uint8_t *begin, const uint8_t *end) {
  const uint8_t *p = begin;
  ssize_t slen;

  for (; p != end && *p == ';';) {
    ++p;

    sf_discard_sp_end_err(p, end, -1);

    slen = sf_parse_key(p, end);
    if (slen < 0) {
      return -1;
    }

    p += slen;

    if (p == end || *p != '=') {
      /* Boolean true */
    } else if (++p == end) {
      return -1;
    } else {
      slen = sf_parse_bare_item(NULL, p, end);
      if (slen < 0) {
        return -1;
      }

      p += slen;
    }
  }

  return p - begin;
}